

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_update_format_string(bcf_hdr_t *hdr,bcf1_t *line,char *key,char **values,int n)

{
  char *pcVar1;
  size_t sVar2;
  void *values_00;
  int local_5c;
  int ret;
  int j;
  char *src;
  char *dst;
  char *out;
  int len;
  int max_len;
  int i;
  int n_local;
  char **values_local;
  char *key_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  if (n == 0) {
    hdr_local._4_4_ = bcf_update_format(hdr,line,key,(void *)0x0,0,3);
  }
  else {
    out._4_4_ = 0;
    for (len = 0; len < n; len = len + 1) {
      sVar2 = strlen(values[len]);
      if (out._4_4_ < (int)sVar2) {
        out._4_4_ = (int)sVar2;
      }
    }
    values_00 = malloc((long)(out._4_4_ * n));
    if (values_00 == (void *)0x0) {
      hdr_local._4_4_ = -2;
    }
    else {
      for (len = 0; len < n; len = len + 1) {
        pcVar1 = values[len];
        for (local_5c = 0; pcVar1[local_5c] != '\0'; local_5c = local_5c + 1) {
          *(char *)((long)values_00 + (long)local_5c + (long)(len * out._4_4_)) = pcVar1[local_5c];
        }
        for (; local_5c < out._4_4_; local_5c = local_5c + 1) {
          *(undefined1 *)((long)values_00 + (long)local_5c + (long)(len * out._4_4_)) = 0;
        }
      }
      hdr_local._4_4_ = bcf_update_format(hdr,line,key,values_00,out._4_4_ * n,3);
      free(values_00);
    }
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_update_format_string(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const char **values, int n)
{
    if ( !n )
        return bcf_update_format(hdr,line,key,NULL,0,BCF_HT_STR);

    int i, max_len = 0;
    for (i=0; i<n; i++)
    {
        int len = strlen(values[i]);
        if ( len > max_len ) max_len = len;
    }
    char *out = (char*) malloc(max_len*n);
    if ( !out ) return -2;
    for (i=0; i<n; i++)
    {
        char *dst = out+i*max_len;
        const char *src = values[i];
        int j = 0;
        while ( src[j] ) { dst[j] = src[j]; j++; }
        for (; j<max_len; j++) dst[j] = 0;
    }
    int ret = bcf_update_format(hdr,line,key,out,max_len*n,BCF_HT_STR);
    free(out);
    return ret;
}